

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

string * __thiscall
cmGlobalUnixMakefileGenerator3::GetEditCacheCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalUnixMakefileGenerator3 *this)

{
  cmake *this_00;
  size_type sVar1;
  string *psVar2;
  char *pcVar3;
  char *pcVar4;
  allocator<char> local_61;
  string local_60;
  string editCacheCommand;
  
  cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_(&editCacheCommand,(cmGlobalGenerator *)this);
  sVar1 = editCacheCommand._M_string_length;
  std::__cxx11::string::~string((string *)&editCacheCommand);
  if (sVar1 != 0) {
    psVar2 = cmSystemTools::GetCMakeGUICommand_abi_cxx11_();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    return __return_storage_ptr__;
  }
  this_00 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  std::__cxx11::string::string((string *)&editCacheCommand,(string *)&this_00->CMakeEditCommand);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_EDIT_COMMAND",&local_61);
  pcVar3 = cmake::GetCacheDefinition(this_00,&local_60);
  sVar1 = editCacheCommand._M_string_length;
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    std::__cxx11::string::~string((string *)&local_60);
    if (sVar1 == 0) goto LAB_003154fb;
  }
  if (editCacheCommand._M_string_length == 0) {
    cmSystemTools::GetCMakeCursesCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&editCacheCommand);
    if (editCacheCommand._M_string_length == 0) {
      cmSystemTools::GetCMakeGUICommand_abi_cxx11_();
      std::__cxx11::string::_M_assign((string *)&editCacheCommand);
      if (editCacheCommand._M_string_length == 0) goto LAB_003154fb;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_EDIT_COMMAND",&local_61);
  cmake::AddCacheEntry
            (this_00,&local_60,editCacheCommand._M_dataplus._M_p,
             "Path to cache edit program executable.",4);
  std::__cxx11::string::~string((string *)&local_60);
LAB_003154fb:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_EDIT_COMMAND",&local_61);
  pcVar4 = cmake::GetCacheDefinition(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  pcVar3 = "";
  if (pcVar4 != (char *)0x0) {
    pcVar3 = pcVar4;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar3,(allocator<char> *)&local_60);
  std::__cxx11::string::~string((string *)&editCacheCommand);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalUnixMakefileGenerator3::GetEditCacheCommand() const
{
  // If generating for an extra IDE, the edit_cache target cannot
  // launch a terminal-interactive tool, so always use cmake-gui.
  if (!this->GetExtraGeneratorName().empty()) {
    return cmSystemTools::GetCMakeGUICommand();
  }

  // Use an internal cache entry to track the latest dialog used
  // to edit the cache, and use that for the edit_cache target.
  cmake* cm = this->GetCMakeInstance();
  std::string editCacheCommand = cm->GetCMakeEditCommand();
  if (!cm->GetCacheDefinition("CMAKE_EDIT_COMMAND") ||
      !editCacheCommand.empty()) {
    if (editCacheCommand.empty()) {
      editCacheCommand = cmSystemTools::GetCMakeCursesCommand();
    }
    if (editCacheCommand.empty()) {
      editCacheCommand = cmSystemTools::GetCMakeGUICommand();
    }
    if (!editCacheCommand.empty()) {
      cm->AddCacheEntry("CMAKE_EDIT_COMMAND", editCacheCommand.c_str(),
                        "Path to cache edit program executable.",
                        cmStateEnums::INTERNAL);
    }
  }
  const char* edit_cmd = cm->GetCacheDefinition("CMAKE_EDIT_COMMAND");
  return edit_cmd ? edit_cmd : "";
}